

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void nonius::
     go<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
               (configuration *cfg,
               __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
               first,__normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
                     last,reporter *rep)

{
  configuration cfg_00;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  last_00;
  string *in_R8;
  CompleteType<detail::ResultOf<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2389:47)_()>_>
  samples;
  vector<nonius::parameters,_std::allocator<nonius::parameters>_> all_params;
  vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> benchmarks;
  environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> env;
  sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> analysis;
  CompleteType<detail::ResultOf<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2384:44)_()>_>
  plan;
  undefined8 in_stack_fffffffffffffb58;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  in_stack_fffffffffffffb68;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  in_stack_fffffffffffffb70;
  pointer in_stack_fffffffffffffb78;
  configuration *pcVar1;
  pointer in_stack_fffffffffffffba0;
  pointer ppVar2;
  pointer in_stack_fffffffffffffba8;
  pointer ppVar3;
  pointer in_stack_fffffffffffffbb0;
  pointer in_stack_fffffffffffffbb8;
  pointer pbVar4;
  pointer in_stack_fffffffffffffbc0;
  pointer pbVar5;
  pointer in_stack_fffffffffffffbc8;
  duration<double,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  duration<double,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc10 [32];
  CompleteType<detail::ResultOf<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2384:44)_()>_>
  *__return_storage_ptr__;
  configuration *pcVar6;
  pointer pdVar7;
  duration<double,_std::ratio<1L,_1000000000L>_> dVar8;
  undefined1 in_stack_fffffffffffffc50 [16];
  environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffc60;
  CompleteType<detail::ResultOf<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2384:44)_()>_>
  local_358;
  sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> local_2f8;
  param_configuration local_280;
  execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> local_1d8;
  configuration local_178;
  
  reporter::configure(rep,cfg);
  detail::measure_environment<std::chrono::_V2::system_clock>
            ((environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
             &stack0xfffffffffffffbd0,rep);
  (*rep->_vptr_reporter[10])(rep);
  last_00._M_current = (benchmark *)&stack0xfffffffffffffc10;
  std::__cxx11::string::string((string *)last_00._M_current,(string *)&cfg->filter_pattern);
  filter_benchmarks<__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
            ((vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)
             &stack0xfffffffffffffbb8,(nonius *)first._M_current,last,last_00,in_R8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc10);
  param_configuration::param_configuration(&local_280,&cfg->params);
  generate_params((vector<nonius::parameters,_std::allocator<nonius::parameters>_> *)
                  &stack0xfffffffffffffba0,&local_280);
  param_configuration::~param_configuration(&local_280);
  pcVar1 = cfg;
  ppVar2 = in_stack_fffffffffffffba0;
  ppVar3 = in_stack_fffffffffffffba8;
  for (; in_stack_fffffffffffffba0 != in_stack_fffffffffffffba8;
      in_stack_fffffffffffffba0 = in_stack_fffffffffffffba0 + 1) {
    (*rep->_vptr_reporter[0xb])(rep);
    pbVar4 = in_stack_fffffffffffffbb8;
    pbVar5 = in_stack_fffffffffffffbc0;
    while( true ) {
      __return_storage_ptr__ = &local_358;
      if (in_stack_fffffffffffffbb8 == in_stack_fffffffffffffbc0) break;
      (*rep->_vptr_reporter[0xc])(rep,in_stack_fffffffffffffbb8);
      dVar8.__r = (rep)&stack0xfffffffffffffbd0;
      user_code<nonius::go<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>(nonius::configuration,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,nonius::reporter&)::_lambda()_1_>
                (__return_storage_ptr__,(nonius *)rep,(reporter *)&stack0xfffffffffffffc30,
                 (anon_class_32_4_9fe3b10c *)last_00._M_current);
      execution_plan::operator_cast_to_execution_plan
                (&local_1d8,(execution_plan *)__return_storage_ptr__);
      reporter::measurement_start(rep,&local_1d8);
      execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~execution_plan
                (&local_1d8);
      pdVar7 = (pointer)&stack0xfffffffffffffbd0;
      pcVar6 = cfg;
      user_code<nonius::go<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>(nonius::configuration,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,nonius::reporter&)::_lambda()_2_>
                ((CompleteType<detail::ResultOf<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2389:47)_()>_>
                  *)&stack0xfffffffffffffb68,(nonius *)rep,(reporter *)&stack0xfffffffffffffc30,
                 (anon_class_24_3_b965e527 *)last_00._M_current);
      last_00._M_current = (benchmark *)&local_2f8;
      std::
      vector<std::chrono::duration<double,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1l>>>>
      ::
      vector<__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,void>
                ((vector<std::chrono::duration<double,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1l>>>>
                  *)&stack0xfffffffffffffc30,in_stack_fffffffffffffb68,in_stack_fffffffffffffb70,
                 (allocator_type *)last_00._M_current);
      (*rep->_vptr_reporter[0xe])
                (rep,(sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                      *)&stack0xfffffffffffffc30);
      std::
      _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
      ::~_Vector_base((_Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                       *)&stack0xfffffffffffffc30);
      if (cfg->no_analysis == false) {
        (*rep->_vptr_reporter[0xf])(rep);
        last_00._M_current = (benchmark *)in_stack_fffffffffffffb70._M_current;
        configuration::configuration(&local_178,cfg);
        cfg_00.confidence_interval = (double)in_stack_fffffffffffffbd8;
        cfg_00._0_8_ = in_stack_fffffffffffffbd0.__r;
        cfg_00.resamples = (int)in_stack_fffffffffffffbe0;
        cfg_00._20_4_ = SUB84(in_stack_fffffffffffffbe0,4);
        cfg_00.title._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbe8;
        cfg_00.title._M_string_length = (size_type)in_stack_fffffffffffffbf0.__r;
        cfg_00.title.field_2._0_4_ = (int)in_stack_fffffffffffffbf8;
        cfg_00.title.field_2._4_4_ = SUB84(in_stack_fffffffffffffbf8,4);
        cfg_00.title.field_2._8_4_ = (int)in_stack_fffffffffffffc00;
        cfg_00.title.field_2._12_4_ = SUB84(in_stack_fffffffffffffc00,4);
        cfg_00.output_file._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc08;
        cfg_00.output_file._M_string_length = in_stack_fffffffffffffb58;
        cfg_00.output_file.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffba0;
        cfg_00.output_file.field_2._8_8_ = in_stack_fffffffffffffb68._M_current;
        cfg_00.reporter._M_dataplus._M_p = (pointer)last_00._M_current;
        cfg_00.reporter._M_string_length = (size_type)in_stack_fffffffffffffb78;
        cfg_00.reporter.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffba8;
        cfg_00.reporter.field_2._8_8_ = pcVar1;
        cfg_00.filter_pattern._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbc0;
        cfg_00.filter_pattern._M_string_length = (size_type)in_stack_fffffffffffffbb8;
        cfg_00.filter_pattern.field_2._M_allocated_capacity = (size_type)ppVar2;
        cfg_00.filter_pattern.field_2._8_8_ = ppVar3;
        cfg_00._152_8_ = in_stack_fffffffffffffbb0;
        cfg_00.params.map.
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_buckets = (__buckets_ptr)pbVar4;
        cfg_00.params.map.
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_bucket_count = (size_type)pbVar5;
        cfg_00.params.map.
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)in_stack_fffffffffffffbc8;
        cfg_00.params.map.
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_element_count = (size_type)in_stack_fffffffffffffbd0.__r;
        cfg_00.params.map.
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_rehash_policy._M_max_load_factor = (float)(int)in_stack_fffffffffffffbd8;
        cfg_00.params.map.
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_rehash_policy._4_4_ = SUB84(in_stack_fffffffffffffbd8,4);
        cfg_00.params.map.
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_rehash_policy._M_next_resize._0_4_ = (int)in_stack_fffffffffffffbe0;
        cfg_00.params.map.
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_rehash_policy._M_next_resize._4_4_ = SUB84(in_stack_fffffffffffffbe0,4);
        cfg_00.params.map.
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_single_bucket = (__node_base_ptr)in_stack_fffffffffffffbe8;
        cfg_00.params.run.storage.__align =
             (anon_struct_8_0_00000001_for___align)in_stack_fffffffffffffbf0.__r;
        cfg_00.params.run.storage._8_4_ = (int)in_stack_fffffffffffffbf8;
        cfg_00.params.run.storage._12_4_ = SUB84(in_stack_fffffffffffffbf8,4);
        cfg_00.params.run.storage._16_4_ = (int)in_stack_fffffffffffffc00;
        cfg_00.params.run.storage._20_4_ = SUB84(in_stack_fffffffffffffc00,4);
        cfg_00.params.run.storage._24_8_ = in_stack_fffffffffffffc08;
        cfg_00.params.run.storage._32_32_ = in_stack_fffffffffffffc10;
        cfg_00.params.run.storage._64_8_ = __return_storage_ptr__;
        cfg_00.params.run.storage._72_8_ = pcVar6;
        cfg_00.params.run.storage._80_8_ = pdVar7;
        cfg_00.params.run.storage._88_8_ = dVar8.__r;
        cfg_00.params.run._96_16_ = in_stack_fffffffffffffc50;
        in_stack_fffffffffffffb70._M_current =
             (duration<double,_std::ratio<1L,_1000000000L>_> *)last_00._M_current;
        detail::
        analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>
                  ((sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
                   &stack0xfffffffffffffc30,(detail *)&local_178,cfg_00,in_stack_fffffffffffffc60,
                   in_stack_fffffffffffffb68,
                   (__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                    )last_00._M_current);
        configuration::~configuration(&local_178);
        sample_analysis::operator_cast_to_sample_analysis
                  (&local_2f8,(sample_analysis *)&stack0xfffffffffffffc30);
        (*rep->_vptr_reporter[0x10])(rep,&local_2f8);
        std::
        _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
        ::~_Vector_base((_Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                         *)&local_2f8);
        cfg = pcVar1;
        std::
        _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
        ::~_Vector_base((_Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                         *)&stack0xfffffffffffffc30);
        pcVar1 = cfg;
      }
      (*rep->_vptr_reporter[0x12])(rep);
      std::
      _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ::~_Vector_base((_Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                       *)&stack0xfffffffffffffb68);
      execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::~execution_plan
                (&local_358);
      in_stack_fffffffffffffbb8 = in_stack_fffffffffffffbb8 + 1;
    }
    (*rep->_vptr_reporter[0x13])(rep);
    in_stack_fffffffffffffbb8 = pbVar4;
    in_stack_fffffffffffffbc0 = pbVar5;
  }
  (*rep->_vptr_reporter[0x14])(rep);
  std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>::~vector
            ((vector<nonius::parameters,_std::allocator<nonius::parameters>_> *)
             &stack0xfffffffffffffba0);
  std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>::~vector
            ((vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)
             &stack0xfffffffffffffbb8);
  return;
}

Assistant:

void go(configuration cfg, Iterator first, Iterator last, reporter& rep) {
        rep.configure(cfg);

        auto env = detail::measure_environment<Clock>(rep);
        rep.suite_start();

        auto benchmarks = filter_benchmarks(first, last, cfg.filter_pattern);
        auto all_params = generate_params(cfg.params);

        for (auto&& params : all_params) {
            rep.params_start(params);
            for (auto&& bench : benchmarks) {
                rep.benchmark_start(bench.name);

                auto plan = user_code(rep, [&]{
                    return bench.template prepare<Clock>(cfg, params, env);
                });

                rep.measurement_start(plan);
                auto samples = user_code(rep, [&]{
                    return plan.template run<Clock>(cfg, env);
                });
                rep.measurement_complete(std::vector<fp_seconds>(samples.begin(), samples.end()));

                if(!cfg.no_analysis) {
                    rep.analysis_start();
                    auto analysis = detail::analyse(cfg, env, samples.begin(), samples.end());
                    rep.analysis_complete(analysis);
                }

                rep.benchmark_complete();
            }
            rep.params_complete();
        }

        rep.suite_complete();
    }